

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmap.cpp
# Opt level: O1

void change_setting_proc(Am_Object *self)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  Am_Value *pAVar4;
  short *psVar5;
  Am_Object *pAVar6;
  Am_Value_Type *pAVar7;
  ulong uVar8;
  bool bVar9;
  Am_Input_Char c;
  Am_Alignment h_align;
  Am_Object inter;
  Am_Input_Char local_6c;
  Am_Value local_68;
  undefined1 local_54 [12];
  Am_Input_Char local_48;
  Am_Input_Char local_44;
  Am_Input_Char local_40;
  Am_Input_Char local_3c;
  Am_Input_Char local_38;
  Am_Input_Char local_34;
  Am_Input_Char local_30;
  Am_Input_Char local_2c;
  Am_Input_Char local_28;
  Am_Input_Char local_24;
  Am_Input_Char local_20;
  Am_Input_Char local_1c;
  Am_Object local_18;
  
  Am_Object::Get_Object((ushort)&local_18,(ulong)self);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x11b);
  Am_Input_Char::Am_Input_Char(&local_6c,pAVar4);
  Am_Input_Char::Am_Input_Char(&local_1c,"q",true);
  bVar9 = ((uint)local_1c & 0xffff) != 0x103;
  if (!(bool)((bVar9 && local_6c.code == 0x103) | ~(bVar9 || local_6c.code == 0x103) & 1U)) {
    cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_6c);
    if (cVar1 != '\0') {
      Am_Exit_Main_Event_Loop();
      goto LAB_00103546;
    }
  }
  Am_Input_Char::Am_Input_Char(&local_20,"S",true);
  bVar9 = ((uint)local_20 & 0xffff) != 0x103;
  if (!(bool)((bVar9 && local_6c.code == 0x103) | ~(bVar9 || local_6c.code == 0x103) & 1U)) {
    cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_6c);
    if (cVar1 != '\0') {
      uVar2 = (uint)change_setting_proc(Am_Object)::switcher;
      change_setting_proc(Am_Object)::switcher = (byte)(uVar2 ^ 1);
      Am_Object::Set(0x7238,0xa2,(ulong)((uVar2 ^ 1) * 4 + 4));
      goto LAB_00103546;
    }
  }
  Am_Input_Char::Am_Input_Char(&local_24,"T",true);
  bVar9 = ((uint)local_24 & 0xffff) != 0x103;
  if (!(bool)((bVar9 && local_6c.code == 0x103) | ~(bVar9 || local_6c.code == 0x103) & 1U)) {
    cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_6c);
    if (cVar1 != '\0') {
      if (change_setting_proc(Am_Object)::instance == '\0') {
        change_setting_proc();
      }
      cVar1 = Am_Object::Valid();
      if (cVar1 == '\0') {
        Am_Object::Create((char *)&local_68);
        pAVar6 = (Am_Object *)Am_Object::Set((ushort)&local_68,0x65,0x32);
        Am_Object::operator=(&change_setting_proc::instance,pAVar6);
        Am_Object::~Am_Object((Am_Object *)&local_68);
        Am_Object::Am_Object((Am_Object *)(local_54 + 4),&change_setting_proc::instance);
        Am_Object::Add_Part((Am_Object)0x107230,(bool)((char)local_54 + '\x04'),1);
        Am_Object::~Am_Object((Am_Object *)(local_54 + 4));
      }
      else {
        Am_Object::Destroy();
      }
      goto LAB_00103546;
    }
  }
  Am_Input_Char::Am_Input_Char(&local_28,"s",true);
  bVar9 = ((uint)local_28 & 0xffff) != 0x103;
  if (!(bool)((bVar9 && local_6c.code == 0x103) | ~(bVar9 || local_6c.code == 0x103) & 1U)) {
    cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_6c);
    if (cVar1 != '\0') {
      pAVar4 = (Am_Value *)Am_Object::Get(0x7248,(ulong)STAGGER);
      bVar9 = Am_Value::operator_cast_to_bool(pAVar4);
      Am_Object::Set(0x7248,SUB21(STAGGER,0),(ulong)!bVar9);
      pAVar4 = (Am_Value *)Am_Object::Get(0x7258,(ulong)STAGGER);
      bVar9 = Am_Value::operator_cast_to_bool(pAVar4);
      Am_Object::Set(0x7258,SUB21(STAGGER,0),(ulong)!bVar9);
      goto LAB_00103546;
    }
  }
  Am_Input_Char::Am_Input_Char(&local_2c,"r",true);
  bVar9 = ((uint)local_2c & 0xffff) != 0x103;
  if (!(bool)((bVar9 && local_6c.code == 0x103) | ~(bVar9 || local_6c.code == 0x103) & 1U)) {
    cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_6c);
    if (cVar1 != '\0') {
      psVar5 = (short *)Am_Object::Get(0x7240,0x9c);
      uVar8 = 3;
      if (*psVar5 == 2) {
        pAVar4 = (Am_Value *)Am_Object::Get(0x7240,0x9c);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        uVar8 = (ulong)((uint)(iVar3 == 0) * 3);
      }
      Am_Object::Set(0x7240,0x9c,uVar8);
      psVar5 = (short *)Am_Object::Get(0x7250,0x9c);
      uVar8 = 3;
      if (*psVar5 == 2) {
        pAVar4 = (Am_Value *)Am_Object::Get(0x7250,0x9c);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        uVar8 = (ulong)((uint)(iVar3 == 0) * 3);
      }
      Am_Object::Set(0x7250,0x9c,uVar8);
      goto LAB_00103546;
    }
  }
  Am_Input_Char::Am_Input_Char(&local_30,"1",true);
  bVar9 = ((uint)local_30 & 0xffff) != 0x103;
  if (!(bool)((bVar9 && local_6c.code == 0x103) | ~(bVar9 || local_6c.code == 0x103) & 1U)) {
    cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_6c);
    if (cVar1 != '\0') {
      psVar5 = (short *)Am_Object::Get(0x7240,0x9c);
      uVar8 = 1;
      if (*psVar5 == 2) {
        pAVar4 = (Am_Value *)Am_Object::Get(0x7240,0x9c);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        uVar8 = (ulong)(iVar3 == 0);
      }
      Am_Object::Set(0x7240,0x9c,uVar8);
      psVar5 = (short *)Am_Object::Get(0x7250,0x9c);
      uVar8 = 1;
      if (*psVar5 == 2) {
        pAVar4 = (Am_Value *)Am_Object::Get(0x7250,0x9c);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        uVar8 = (ulong)(iVar3 == 0);
      }
      Am_Object::Set(0x7250,0x9c,uVar8);
      goto LAB_00103546;
    }
  }
  Am_Input_Char::Am_Input_Char(&local_34,"z",true);
  bVar9 = Am_Input_Char::operator==(&local_6c,local_34);
  if (bVar9) {
    psVar5 = (short *)Am_Object::Get(0x7240,0x9d);
    uVar8 = 0x46;
    if (*psVar5 == 2) {
      pAVar4 = (Am_Value *)Am_Object::Get(0x7240,0x9d);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      uVar8 = 0x46;
      if (iVar3 != 0) {
        uVar8 = 0;
      }
    }
    Am_Object::Set(0x7240,0x9d,uVar8);
    psVar5 = (short *)Am_Object::Get(0x7250,0x9d);
    uVar8 = 0x5e;
    if (*psVar5 == 2) {
      pAVar4 = (Am_Value *)Am_Object::Get(0x7250,0x9d);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      uVar8 = 0x5e;
      if (iVar3 != 0) {
        uVar8 = 0;
      }
    }
    Am_Object::Set(0x7250,0x9d,uVar8);
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_38,"w",true);
    bVar9 = Am_Input_Char::operator==(&local_6c,local_38);
    if (bVar9) {
      pAVar4 = (Am_Value *)Am_Object::Get(0x7240,0x99);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      Am_Object::Set(0x7240,0x99,(ulong)(iVar3 == 0));
      pAVar4 = (Am_Value *)Am_Object::Get(0x7250,0x99);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      Am_Object::Set(0x7250,0x99,(ulong)(iVar3 == 0));
    }
    else {
      Am_Input_Char::Am_Input_Char(&local_3c,"h",true);
      bVar9 = Am_Input_Char::operator==(&local_6c,local_3c);
      if (bVar9) {
        pAVar4 = (Am_Value *)Am_Object::Get(0x7240,0x9a);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        Am_Object::Set(0x7240,0x9a,(ulong)(iVar3 == 0));
        pAVar4 = (Am_Value *)Am_Object::Get(0x7250,0x9a);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        Am_Object::Set(0x7250,0x9a,(ulong)(iVar3 == 0));
      }
      else {
        Am_Input_Char::Am_Input_Char(&local_40,"a",true);
        bVar9 = Am_Input_Char::operator==(&local_6c,local_40);
        if (bVar9) {
          pAVar4 = (Am_Value *)Am_Object::Get(0x7240,0x97);
          Am_Alignment::Am_Alignment((Am_Alignment *)local_54,pAVar4);
          if (local_54._0_4_ == Am_LEFT_ALIGN_val) {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_RIGHT_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7240,(Am_Value *)0x97,(ulong)&local_68);
          }
          else if (local_54._0_4_ == Am_RIGHT_ALIGN_val) {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_CENTER_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7240,(Am_Value *)0x97,(ulong)&local_68);
          }
          else {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_LEFT_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7240,(Am_Value *)0x97,(ulong)&local_68);
          }
          Am_Value::~Am_Value(&local_68);
          pAVar7 = (Am_Value_Type *)Am_Object::Get(0x7250,0x97);
          if ((*pAVar7 != 1) && (*pAVar7 != (Am_Value_Type)Am_Alignment::Am_Alignment_ID)) {
            Am_Alignment::TypeError((Am_Value *)local_54);
          }
          local_54._0_4_ = *(undefined4 *)(pAVar7 + 4);
          if (local_54._0_4_ == Am_RIGHT_ALIGN_val) {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_CENTER_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7250,(Am_Value *)0x97,(ulong)&local_68);
          }
          else if (local_54._0_4_ == Am_LEFT_ALIGN_val) {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_RIGHT_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7250,(Am_Value *)0x97,(ulong)&local_68);
          }
          else {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_LEFT_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7250,(Am_Value *)0x97,(ulong)&local_68);
          }
        }
        else {
          Am_Input_Char::Am_Input_Char(&local_44,"b",true);
          bVar9 = Am_Input_Char::operator==(&local_6c,local_44);
          if (!bVar9) {
            Am_Input_Char::Am_Input_Char(&local_48,"i",true);
            bVar9 = Am_Input_Char::operator==(&local_6c,local_48);
            if (bVar9) {
              pAVar4 = (Am_Value *)Am_Object::Get(0x7240,0x9b);
              iVar3 = Am_Value::operator_cast_to_int(pAVar4);
              uVar8 = 10;
              if (iVar3 != 0) {
                uVar8 = 0;
              }
              Am_Object::Set(0x7240,0x9b,uVar8);
              pAVar4 = (Am_Value *)Am_Object::Get(0x7250,0x9b);
              iVar3 = Am_Value::operator_cast_to_int(pAVar4);
              uVar8 = 10;
              if (iVar3 != 0) {
                uVar8 = 0;
              }
              Am_Object::Set(0x7250,0x9b,uVar8);
            }
            else {
              print_help();
            }
            goto LAB_00103546;
          }
          pAVar4 = (Am_Value *)Am_Object::Get(0x7240,0x98);
          Am_Alignment::Am_Alignment((Am_Alignment *)local_54,pAVar4);
          if (local_54._0_4_ == Am_TOP_ALIGN_val) {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_BOTTOM_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7240,(Am_Value *)0x98,(ulong)&local_68);
          }
          else if (local_54._0_4_ == Am_BOTTOM_ALIGN_val) {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_CENTER_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7240,(Am_Value *)0x98,(ulong)&local_68);
          }
          else {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_TOP_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7240,(Am_Value *)0x98,(ulong)&local_68);
          }
          Am_Value::~Am_Value(&local_68);
          pAVar7 = (Am_Value_Type *)Am_Object::Get(0x7250,0x98);
          if ((*pAVar7 != 1) && (*pAVar7 != (Am_Value_Type)Am_Alignment::Am_Alignment_ID)) {
            Am_Alignment::TypeError((Am_Value *)local_54);
          }
          local_54._0_4_ = *(undefined4 *)(pAVar7 + 4);
          if (local_54._0_4_ == Am_BOTTOM_ALIGN_val) {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_CENTER_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7250,(Am_Value *)0x98,(ulong)&local_68);
          }
          else if (local_54._0_4_ == Am_TOP_ALIGN_val) {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_BOTTOM_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7250,(Am_Value *)0x98,(ulong)&local_68);
          }
          else {
            local_68.value.long_value._4_4_ = 0;
            local_68.value.float_value = (float)Am_TOP_ALIGN.value;
            local_68.type = (Am_Value_Type)Am_Alignment::Am_Alignment_ID;
            Am_Object::Set(0x7250,(Am_Value *)0x98,(ulong)&local_68);
          }
        }
        Am_Value::~Am_Value(&local_68);
      }
    }
  }
LAB_00103546:
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, change_setting, (Am_Object self))
{
  Am_Object inter = self.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  if (c == "q") {
    Am_Exit_Main_Event_Loop();
  } else if (c == "S") {
    static bool switcher = false;
    if (switcher) {
      switcher = false;
      map1.Set(Am_ITEMS, 4);
    } else {
      switcher = true;
      map1.Set(Am_ITEMS, 8);
    }
  } else if (c == "T") {
    static Am_Object instance = nullptr;
    if (instance.Valid()) {
      instance.Destroy();
    } else {
      instance = map1.Create("map2").Set(Am_TOP, 50);
      window.Add_Part(instance);
    }
  } else if (c == "s") {
    bool stagger = layout_proto1.Get(STAGGER);
    layout_proto1.Set(STAGGER, !stagger);
    stagger = layout_proto2.Get(STAGGER);
    layout_proto2.Set(STAGGER, !stagger);
  } else if (c == "r") {
    int max_rank;
    if (layout1.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout1.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout1.Set(Am_MAX_RANK, max_rank ? 0 : 3);
    if (layout2.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout2.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout2.Set(Am_MAX_RANK, max_rank ? 0 : 3);
  } else if (c == "1") {
    int max_rank;
    if (layout1.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout1.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout1.Set(Am_MAX_RANK, max_rank ? 0 : 1);
    if (layout2.Get_Slot_Type(Am_MAX_RANK) == Am_INT)
      max_rank = layout2.Get(Am_MAX_RANK);
    else
      max_rank = 0;
    layout2.Set(Am_MAX_RANK, max_rank ? 0 : 1);
  } else if (c == "z") {
    int max_size;
    if (layout1.Get_Slot_Type(Am_MAX_SIZE) == Am_INT)
      max_size = layout1.Get(Am_MAX_SIZE);
    else
      max_size = 0;
    layout1.Set(Am_MAX_SIZE, max_size ? 0 : 70);
    if (layout2.Get_Slot_Type(Am_MAX_SIZE) == Am_INT)
      max_size = layout2.Get(Am_MAX_SIZE);
    else
      max_size = 0;
    layout2.Set(Am_MAX_SIZE, max_size ? 0 : 94);
  } else if (c == "w") {
    int fixed_width = layout1.Get(Am_FIXED_WIDTH);
    layout1.Set(Am_FIXED_WIDTH,
                fixed_width ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
    fixed_width = layout2.Get(Am_FIXED_WIDTH);
    layout2.Set(Am_FIXED_WIDTH,
                fixed_width ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
  } else if (c == "h") {
    int fixed_height = layout1.Get(Am_FIXED_HEIGHT);
    layout1.Set(Am_FIXED_HEIGHT,
                fixed_height ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
    fixed_height = layout2.Get(Am_FIXED_HEIGHT);
    layout2.Set(Am_FIXED_HEIGHT,
                fixed_height ? Am_NOT_FIXED_SIZE : Am_MAX_FIXED_SIZE);
  } else if (c == "a") {
    Am_Alignment h_align = layout1.Get(Am_H_ALIGN);
    switch (h_align.value) {
    case Am_LEFT_ALIGN_val:
      layout1.Set(Am_H_ALIGN, Am_RIGHT_ALIGN);
      break;
    case Am_RIGHT_ALIGN_val:
      layout1.Set(Am_H_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout1.Set(Am_H_ALIGN, Am_LEFT_ALIGN);
      break;
    }
    h_align = layout2.Get(Am_H_ALIGN);
    switch (h_align.value) {
    case Am_LEFT_ALIGN_val:
      layout2.Set(Am_H_ALIGN, Am_RIGHT_ALIGN);
      break;
    case Am_RIGHT_ALIGN_val:
      layout2.Set(Am_H_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout2.Set(Am_H_ALIGN, Am_LEFT_ALIGN);
      break;
    }
  } else if (c == "b") {
    Am_Alignment v_align = layout1.Get(Am_V_ALIGN);
    switch (v_align.value) {
    case Am_TOP_ALIGN_val:
      layout1.Set(Am_V_ALIGN, Am_BOTTOM_ALIGN);
      break;
    case Am_BOTTOM_ALIGN_val:
      layout1.Set(Am_V_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout1.Set(Am_V_ALIGN, Am_TOP_ALIGN);
      break;
    }
    v_align = layout2.Get(Am_V_ALIGN);
    switch (v_align.value) {
    case Am_TOP_ALIGN_val:
      layout2.Set(Am_V_ALIGN, Am_BOTTOM_ALIGN);
      break;
    case Am_BOTTOM_ALIGN_val:
      layout2.Set(Am_V_ALIGN, Am_CENTER_ALIGN);
      break;
    default:
      layout2.Set(Am_V_ALIGN, Am_TOP_ALIGN);
      break;
    }
  } else if (c == "i") {
    int indent = layout1.Get(Am_INDENT);
    layout1.Set(Am_INDENT, indent ? 0 : 10);
    indent = layout2.Get(Am_INDENT);
    layout2.Set(Am_INDENT, indent ? 0 : 10);
  } else
    print_help();
}